

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::ScopeObjectChain::TryGetDebuggerScopePropertyInfo
          (ScopeObjectChain *this,PropertyId propertyId,RegSlot location,int offset,
          bool *isPropertyInDebuggerScope,bool *isConst,bool *isInDeadZone)

{
  DebuggerScope *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01
  ;
  int index;
  undefined1 local_58 [8];
  DebuggerScopeProperty debuggerScopeProperty;
  
  if ((this->pScopeChain).ptr ==
      (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1831,"(pScopeChain)","pScopeChain");
    if (!bVar2) goto LAB_0076c7e1;
    *puVar3 = 0;
  }
  if (isPropertyInDebuggerScope == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1832,"(isPropertyInDebuggerScope)","isPropertyInDebuggerScope");
    if (!bVar2) goto LAB_0076c7e1;
    *puVar3 = 0;
  }
  if (isConst == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1833,"(isConst)","isConst");
    if (!bVar2) {
LAB_0076c7e1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  index = 0;
  *isPropertyInDebuggerScope = false;
  *isConst = false;
  this_01 = (this->pScopeChain).ptr;
  if (0 < (this_01->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
          count) {
    debuggerScopeProperty._8_8_ = isConst;
    do {
      pTVar4 = JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,index);
      this_00 = pTVar4->ptr;
      if (1 < this_00->scopeType - DiagParamScope) {
        bVar2 = DebuggerScope::TryGetProperty
                          (this_00,propertyId,location,(DebuggerScopeProperty *)local_58);
        if (bVar2) {
          bVar2 = DebuggerScope::IsOffsetInScope(this_00,offset);
          if (bVar2) {
            *isPropertyInDebuggerScope = true;
            if (isInDeadZone != (bool *)0x0) {
              bVar2 = DebuggerScopeProperty::IsInDeadZone((DebuggerScopeProperty *)local_58,offset);
              *isInDeadZone = bVar2;
            }
            *(byte *)debuggerScopeProperty._8_8_ = (byte)debuggerScopeProperty.location & 1;
            index = 1;
            goto LAB_0076c7cf;
          }
          *isPropertyInDebuggerScope = this_00->scopeType != DiagBlockScopeInObject;
        }
      }
      index = index + 1;
      this_01 = (this->pScopeChain).ptr;
    } while (index < (this_01->
                     super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
                     count);
    index = 0;
  }
LAB_0076c7cf:
  return SUB41(index,0);
}

Assistant:

bool ScopeObjectChain::TryGetDebuggerScopePropertyInfo(PropertyId propertyId, RegSlot location, int offset, bool* isPropertyInDebuggerScope, bool *isConst, bool* isInDeadZone)
    {
        Assert(pScopeChain);
        Assert(isPropertyInDebuggerScope);
        Assert(isConst);

        *isPropertyInDebuggerScope = false;
        *isConst = false;

        // Search through each block scope until we find the current scope.  If the register was found
        // in any of the scopes going down until we reach the scope of the debug break, then it's in scope.
        // if found but not in the scope, the out param will be updated (since it is actually a let or const), so that caller can make a call accordingly.
        for (int i = 0; i < pScopeChain->Count(); i++)
        {
            Js::DebuggerScope *debuggerScope = pScopeChain->Item(i);
            DebuggerScopeProperty debuggerScopeProperty;
            if (!debuggerScope->IsParamScope() && debuggerScope->TryGetProperty(propertyId, location, &debuggerScopeProperty))
            {
                bool isOffsetInScope = debuggerScope->IsOffsetInScope(offset);

                // For the Object scope, all the properties will have the same location (-1) so they can match. Use further check below to determine the propertyInDebuggerScope
                *isPropertyInDebuggerScope = isOffsetInScope || !debuggerScope->IsBlockObjectScope();

                if (isOffsetInScope)
                {
                    if (isInDeadZone != nullptr)
                    {
                        *isInDeadZone = debuggerScopeProperty.IsInDeadZone(offset);
                    }

                    *isConst = debuggerScopeProperty.IsConst();
                    return true;
                }
            }
        }

        return false;
    }